

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_user.cpp
# Opt level: O2

void P_UnPredictPlayer(void)

{
  undefined4 uVar1;
  APlayerPawn *this;
  anon_union_8_2_947301c2_for_TObjPtr<AInventory>_1 aVar2;
  sector_t *psVar3;
  AActor *pAVar4;
  msecnode_t *pmVar5;
  FBlockNode *pFVar6;
  sector_t_conflict **ppsVar7;
  AActor **ppAVar8;
  msecnode_t **ppmVar9;
  long lVar10;
  long lVar11;
  AActor *pAVar12;
  AActor **ppAVar13;
  FBlockNode **ppFVar14;
  ulong uVar15;
  msecnode_t **ppmVar16;
  msecnode_t *pmVar17;
  msecnode_t *pmVar18;
  FLinkContext *pFVar19;
  bool bVar20;
  FLinkContext ctx;
  FLinkContext local_38;
  
  pFVar19 = &local_38;
  lVar10 = (long)consoleplayer;
  lVar11 = lVar10 * 0x2a0;
  if (((&DAT_017dc069)[lVar11] & 0x20) != 0) {
    this = ((player_t *)(&players + lVar10 * 0x54))->mo;
    pAVar12 = GC::ReadBarrier<AActor>((AActor **)(&DAT_017dc0f8 + lVar10 * 0x54));
    aVar2 = (this->InvSel).field_0;
    uVar1 = *(undefined4 *)(&DAT_017dc01c + lVar11);
    player_t::operator=((player_t *)(&players + lVar10 * 0x54),&PredictionPlayerBackup);
    (&DAT_017dc0f8)[lVar10 * 0x54] = pAVar12;
    local_38.sector_list = (msecnode_t *)0x0;
    local_38.render_list = (msecnode_t *)0x0;
    AActor::UnlinkFromWorld(&this->super_AActor,&local_38);
    memcpy(&(this->super_AActor).snext,PredictionActorBackup,0x530);
    if (((this->super_AActor).flags.Value & 8) == 0) {
      psVar3 = (this->super_AActor).Sector;
      psVar3->thinglist = (AActor *)0x0;
      ppAVar8 = PredictionSectorListBackup.Array;
      ppAVar13 = &psVar3->thinglist;
      uVar15 = (ulong)PredictionSectorListBackup.Count;
      pAVar12 = (AActor *)0x0;
      while (bVar20 = uVar15 != 0, uVar15 = uVar15 - 1, bVar20) {
        pAVar4 = ppAVar8[uVar15];
        pAVar4->snext = pAVar12;
        if (pAVar12 != (AActor *)0x0) {
          pAVar12->sprev = &pAVar4->snext;
        }
        pAVar4->sprev = ppAVar13;
        *ppAVar13 = pAVar4;
        pAVar12 = pAVar4;
      }
      while (lVar10 = *(long *)pFVar19, lVar10 != 0) {
        *(undefined8 *)(lVar10 + 8) = 0;
        pFVar19 = (FLinkContext *)(lVar10 + 0x18);
      }
      P_DelSeclist(local_38.sector_list,0x1c0);
      local_38.sector_list = (msecnode_t *)0x0;
      uVar15 = (ulong)PredictionTouchingSectorsBackup.Count;
      while (bVar20 = uVar15 != 0, uVar15 = uVar15 - 1, bVar20) {
        local_38.sector_list =
             P_AddSecnode(PredictionTouchingSectorsBackup.Array[uVar15],&this->super_AActor,
                          local_38.sector_list,
                          &PredictionTouchingSectorsBackup.Array[uVar15]->touching_thinglist);
      }
      (this->super_AActor).touching_sectorlist = local_38.sector_list;
      ppmVar9 = PredictionSector_sprev_Backup.Array;
      ppsVar7 = PredictionTouchingSectorsBackup.Array;
      uVar15 = (ulong)PredictionTouchingSectorsBackup.Count;
LAB_00466265:
      bVar20 = uVar15 != 0;
      uVar15 = uVar15 - 1;
      if (bVar20) {
        if (ppmVar9[uVar15] != (msecnode_t *)0x0) {
          ppmVar16 = &ppsVar7[uVar15]->touching_thinglist;
          while (pmVar5 = *ppmVar16, pmVar5 != (msecnode_t *)0x0) {
            if ((APlayerPawn *)pmVar5->m_thing == this) {
              pmVar17 = pmVar5->m_sprev;
              if (pmVar17 == (msecnode_t *)0x0) {
                ppmVar16 = &pmVar5->m_sector->touching_thinglist;
              }
              else {
                ppmVar16 = &pmVar17->m_snext;
              }
              pmVar18 = pmVar5->m_snext;
              *ppmVar16 = pmVar18;
              if (pmVar18 != (msecnode_t *)0x0) {
                pmVar18->m_sprev = pmVar17;
              }
              pmVar17 = ppmVar9[uVar15];
              pmVar5->m_sprev = pmVar17;
              if (pmVar17->m_snext == (msecnode_t *)0x0) {
                pmVar18 = (msecnode_t *)0x0;
              }
              else {
                pmVar17->m_snext->m_sprev = pmVar5;
                pmVar17 = pmVar5->m_sprev;
                pmVar18 = pmVar17->m_snext;
              }
              pmVar5->m_snext = pmVar18;
              pmVar17->m_snext = pmVar5;
              break;
            }
            ppmVar16 = &pmVar5->m_snext;
          }
        }
        goto LAB_00466265;
      }
    }
    ppFVar14 = &(this->super_AActor).BlockNode;
    while (pFVar6 = *ppFVar14, pFVar6 != (FBlockNode *)0x0) {
      *pFVar6->PrevActor = pFVar6;
      if (pFVar6->NextActor != (FBlockNode *)0x0) {
        pFVar6->NextActor->PrevActor = &pFVar6->NextActor;
      }
      ppFVar14 = &pFVar6->NextBlock;
    }
    (this->InvSel).field_0 = aVar2;
    *(undefined4 *)(&DAT_017dc01c + lVar11) = uVar1;
  }
  return;
}

Assistant:

void P_UnPredictPlayer ()
{
	player_t *player = &players[consoleplayer];

	if (player->cheats & CF_PREDICTING)
	{
		unsigned int i;
		APlayerPawn *act = player->mo;
		AActor *savedcamera = player->camera;

		TObjPtr<AInventory> InvSel = act->InvSel;
		int inventorytics = player->inventorytics;

		*player = PredictionPlayerBackup;

		// Restore the camera instead of using the backup's copy, because spynext/prev
		// could cause it to change during prediction.
		player->camera = savedcamera;

		FLinkContext ctx;
		act->UnlinkFromWorld(&ctx);
		memcpy(&act->snext, PredictionActorBackup, sizeof(APlayerPawn) - ((BYTE *)&act->snext - (BYTE *)act));

		// The blockmap ordering needs to remain unchanged, too.
		// Restore sector links and refrences.
		// [ED850] This is somewhat of a duplicate of LinkToWorld(), but we need to keep every thing the same,
		// otherwise we end up fixing bugs in blockmap logic (i.e undefined behaviour with polyobject collisions),
		// which we really don't want to do here.
		if (!(act->flags & MF_NOSECTOR))
		{
			sector_t *sec = act->Sector;
			AActor *me, *next;
			AActor **link;// , **prev;

			// The thinglist is just a pointer chain. We are restoring the exact same things, so we can NULL the head safely
			sec->thinglist = NULL;

			for (i = PredictionSectorListBackup.Size(); i-- > 0;)
			{
				me = PredictionSectorListBackup[i];
				link = &sec->thinglist;
				next = *link;
				if ((me->snext = next))
					next->sprev = &me->snext;
				me->sprev = link;
				*link = me;
			}

			// Destroy old refrences
			msecnode_t *node = ctx.sector_list;
			while (node)
			{
				node->m_thing = NULL;
				node = node->m_tnext;
			}

			// Make the sector_list match the player's touching_sectorlist before it got predicted.
			P_DelSeclist(ctx.sector_list, &sector_t::touching_thinglist);
			ctx.sector_list = NULL;
			for (i = PredictionTouchingSectorsBackup.Size(); i-- > 0;)
			{
				ctx.sector_list = P_AddSecnode(PredictionTouchingSectorsBackup[i], act, ctx.sector_list, PredictionTouchingSectorsBackup[i]->touching_thinglist);
			}
			act->touching_sectorlist = ctx.sector_list;	// Attach to thing
			ctx.sector_list = NULL;		// clear for next time

			// Huh???
			node = ctx.sector_list;
			while (node)
			{
				if (node->m_thing == NULL)
				{
					if (node == ctx.sector_list)
						ctx.sector_list = node->m_tnext;
					node = P_DelSecnode(node, &sector_t::touching_thinglist);
				}
				else
				{
					node = node->m_tnext;
				}
			}

			msecnode_t *snode;

			// Restore sector thinglist order
			for (i = PredictionTouchingSectorsBackup.Size(); i-- > 0;)
			{
				// If we were already the head node, then nothing needs to change
				if (PredictionSector_sprev_Backup[i] == NULL)
					continue;

				for (snode = PredictionTouchingSectorsBackup[i]->touching_thinglist; snode; snode = snode->m_snext)
				{
					if (snode->m_thing == act)
					{
						if (snode->m_sprev)
							snode->m_sprev->m_snext = snode->m_snext;
						else
							snode->m_sector->touching_thinglist = snode->m_snext;
						if (snode->m_snext)
							snode->m_snext->m_sprev = snode->m_sprev;

						snode->m_sprev = PredictionSector_sprev_Backup[i];

						// At the moment, we don't exist in the list anymore, but we do know what our previous node is, so we set its current m_snext->m_sprev to us.
						if (snode->m_sprev->m_snext)
							snode->m_sprev->m_snext->m_sprev = snode;
						snode->m_snext = snode->m_sprev->m_snext;
						snode->m_sprev->m_snext = snode;
						break;
					}
				}
			}
		}

		// Now fix the pointers in the blocknode chain
		FBlockNode *block = act->BlockNode;

		while (block != NULL)
		{
			*(block->PrevActor) = block;
			if (block->NextActor != NULL)
			{
				block->NextActor->PrevActor = &block->NextActor;
			}
			block = block->NextBlock;
		}

		act->InvSel = InvSel;
		player->inventorytics = inventorytics;
	}
}